

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_finite(REF_GRID ref_grid,REF_INT ldim,REF_DBL *field)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int local_2c;
  
  lVar2 = (long)ref_grid->node->max;
  if (lVar2 < 1) {
    local_2c = 0;
  }
  else {
    lVar3 = 0;
    local_2c = 0;
    do {
      if (-1 < ref_grid->node->global[lVar3] && 0 < ldim) {
        uVar4 = 0;
        do {
          local_2c = local_2c + (uint)(0x7fefffffffffffff < (ulong)ABS(field[uVar4]));
          uVar4 = uVar4 + 1;
        } while ((uint)ldim != uVar4);
      }
      lVar3 = lVar3 + 1;
      field = field + (uint)ldim;
    } while (lVar3 != lVar2);
  }
  uVar1 = ref_mpi_allsum(ref_grid->mpi,&local_2c,1,1);
  if (uVar1 == 0) {
    if (local_2c < 1) {
      uVar1 = 0;
    }
    else {
      uVar1 = 3;
      if (ref_grid->mpi->id == 0) {
        printf("%d not finite\n");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x213,"ref_validation_finite",(ulong)uVar1,"global");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_validation_finite(REF_GRID ref_grid, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT i, node, n;
  n = 0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < ldim; i++) {
      if (!isfinite(field[i + ldim * node])) n++;
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &n, 1, REF_INT_TYPE), "global");
  if (n > 0) {
    if (ref_mpi_once(ref_grid_mpi(ref_grid))) printf("%d not finite\n", n);
    return REF_INVALID;
  }
  return REF_SUCCESS;
}